

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

int __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::cmp
          (iterator *this,void *param_1,void *param_2)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  _Elt_pointer psVar4;
  size_t __n;
  
  psVar4 = (this->stack_).c.
           super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar4 == (this->stack_).c.
                super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    __assert_fail("!stack_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0xa72,
                  "int unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::cmp(const art_key_type &) const [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  if (psVar4 == (this->stack_).c.
                super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    psVar4 = (this->stack_).c.
             super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  uVar2 = psVar4[-1].super_iter_result.node.tagged_ptr;
  if ((uVar2 & 7) == 0) {
    uVar1 = *(uint *)(uVar2 + 0x18);
    __n = 8;
    if (uVar1 < 8) {
      __n = (size_t)uVar1;
    }
    uVar3 = memcmp((void *)(uVar2 + 0x20),param_1,__n);
    if ((uVar3 == 0) && (uVar3 = 0, uVar1 != 8)) {
      uVar3 = -(uint)(uVar1 < 8) | 1;
    }
    return uVar3;
  }
  __assert_fail("node.type() == node_type::LEAF",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0xa74,
                "int unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::cmp(const art_key_type &) const [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

int olc_db<Key, Value>::iterator::cmp(const art_key_type& akey) const noexcept {
  // TODO(thompsonbry) : variable length keys. Explore a cheaper way
  // to handle the exclusive bound case when developing variable
  // length key support based on the maintained key buffer.
  UNODB_DETAIL_ASSERT(!stack_.empty());
  auto& node = stack_.top().node;
  UNODB_DETAIL_ASSERT(node.type() == node_type::LEAF);
  const auto* const leaf{node.template ptr<leaf_type*>()};
  return unodb::detail::compare(leaf->get_key_view(), akey.get_key_view());
}